

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

char * __thiscall CVmObject::get_image_file_version(CVmObject *this)

{
  vm_meta_entry_t *pvVar1;
  CVmMetaTable *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  long lVar5;
  
  pCVar2 = G_meta_table_X;
  iVar3 = (**this->_vptr_CVmObject)();
  pvVar1 = pCVar2->table_;
  lVar5 = (long)pCVar2->reverse_map_[*(uint *)(CONCAT44(extraout_var,iVar3) + 8)];
  if ((pvVar1 != (vm_meta_entry_t *)0x0 && -1 < lVar5) &&
     (pcVar4 = strchr(pvVar1[lVar5].image_meta_name_,0x2f), pcVar4 != (char *)0x0)) {
    return pcVar4 + 1;
  }
  return "";
}

Assistant:

const char *CVmObject::get_image_file_version(VMG0_) const
{
    /* get the metaclass table entry */
    vm_meta_entry_t *entry = G_meta_table->get_entry_from_reg(
        get_metaclass_reg()->get_reg_idx());

    /* if we found it, get the image metaclass string from the entry */
    if (entry != 0)
    {
        /* get the image metaclass name - "name/version" */
        const char *n = entry->image_meta_name_;

        /* scan for the version slash */
        n = strchr(n, '/');

        /* if we found it, the version follows the slash */
        if (n != 0)
            return n + 1;
    }

    /* we couldn't find the version data, so return an empty string */
    return "";
}